

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

void runCommand(string *strCommand)

{
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int nErr;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (strCommand->_M_string_length != 0) {
    nErr = system((strCommand->_M_dataplus)._M_p);
    if (nErr != 0) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/system.cpp"
      ;
      source_file._M_len = 0x61;
      logging_function._M_str = "runCommand";
      logging_function._M_len = 10;
      LogPrintFormatInternal<std::__cxx11::string,int>
                (logging_function,source_file,0x37,ALL,Info,(ConstevalFormatString<2U>)0x1126f14,
                 strCommand,&nErr);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void runCommand(const std::string& strCommand)
{
    if (strCommand.empty()) return;
#ifndef WIN32
    int nErr = ::system(strCommand.c_str());
#else
    int nErr = ::_wsystem(std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>,wchar_t>().from_bytes(strCommand).c_str());
#endif
    if (nErr)
        LogPrintf("runCommand error: system(%s) returned %d\n", strCommand, nErr);
}